

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
PageHeapAlloc(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *this,Recycler *recycler,size_t sizeCat,size_t size,ObjectInfoBits attributes,
             PageHeapMode mode,bool nothrow)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  char *pcVar3;
  Recycler *pRVar4;
  char *addr;
  bool nothrow_local;
  PageHeapMode mode_local;
  ObjectInfoBits attributes_local;
  size_t size_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *this_local
  ;
  
  pCVar2 = Recycler::GetRecyclerFlagsTable(recycler);
  if ((pCVar2->Verbose & 1U) != 0) {
    pCVar2 = Recycler::GetRecyclerFlagsTable(recycler);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Trace,MemoryAllocationPhase);
    if (bVar1) {
      Output::Print(L"In PageHeapAlloc [Size: 0x%x, Attributes: 0x%x]\n",size,(ulong)attributes);
    }
  }
  pcVar3 = LargeHeapBucket::PageHeapAlloc
                     (&((this->super_HeapBucket).heapInfo)->largeObjectBucket,recycler,sizeCat,size,
                      attributes,mode,nothrow);
  if (pcVar3 != (char *)0x0) {
    pRVar4 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    (pRVar4->autoHeap).uncollectedAllocBytes = sizeCat + (pRVar4->autoHeap).uncollectedAllocBytes;
  }
  return pcVar3;
}

Assistant:

char *
HeapBucketT<TBlockType>::PageHeapAlloc(Recycler * recycler, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, size_t size, ObjectInfoBits attributes, PageHeapMode mode, bool nothrow)
{
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("In PageHeapAlloc [Size: 0x%x, Attributes: 0x%x]\n"), size, attributes);
    char* addr =  heapInfo->largeObjectBucket.PageHeapAlloc(recycler, sizeCat, size, attributes, mode, nothrow);

    if (addr)
    {
        this->GetRecycler()->autoHeap.uncollectedAllocBytes += sizeCat;
    }

    return addr;
}